

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_annotator.cpp
# Opt level: O1

void __thiscall flatbuffers::BinaryAnnotator::FixMissingSections(BinaryAnnotator *this)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  BinarySection *pBVar3;
  _Base_ptr p_Var4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  BinarySection *section_to_insert;
  BinarySection *section;
  vector<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_> sections_to_insert
  ;
  vector<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_> local_88;
  BinarySection local_70;
  
  local_88.
  super__Vector_base<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>.
  _M_impl.super__Vector_impl_data._M_start = (BinarySection *)0x0;
  local_88.
  super__Vector_base<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>.
  _M_impl.super__Vector_impl_data._M_finish = (BinarySection *)0x0;
  local_88.
  super__Vector_base<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  p_Var4 = (this->sections_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var1 = &(this->sections_)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var4 == p_Var1) {
    lVar5 = 1;
    uVar7 = 0;
  }
  else {
    uVar6 = 0;
    uVar7 = 0;
    do {
      lVar5 = *(long *)(p_Var4[2]._M_right + -5);
      p_Var2 = p_Var4[2]._M_right[-5]._M_parent;
      if (uVar7 < *(ulong *)(p_Var4 + 1)) {
        anon_unknown_49::GenerateMissingSection
                  (&local_70,uVar7 - 1,uVar6 + *(ulong *)(p_Var4 + 1) + 1,this->binary_);
        std::vector<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>::
        emplace_back<flatbuffers::BinarySection>(&local_88,&local_70);
        std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
                  (&local_70.regions);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.name._M_dataplus._M_p != &local_70.name.field_2) {
          operator_delete(local_70.name._M_dataplus._M_p,
                          local_70.name.field_2._M_allocated_capacity + 1);
        }
      }
      uVar7 = (long)&p_Var2->_M_color + lVar5 + 1;
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
      uVar6 = ~((long)&p_Var2->_M_color + lVar5);
    } while ((_Rb_tree_header *)p_Var4 != p_Var1);
    lVar5 = 1 - uVar7;
  }
  section = local_88.
            super__Vector_base<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pBVar3 = local_88.
           super__Vector_base<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (uVar7 < this->binary_length_) {
    anon_unknown_49::GenerateMissingSection
              (&local_70,uVar7 - 1,lVar5 + this->binary_length_,this->binary_);
    std::vector<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>::
    emplace_back<flatbuffers::BinarySection>(&local_88,&local_70);
    std::vector<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>::~vector
              (&local_70.regions);
    section = local_88.
              super__Vector_base<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pBVar3 = local_88.
             super__Vector_base<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.name._M_dataplus._M_p != &local_70.name.field_2) {
      operator_delete(local_70.name._M_dataplus._M_p,local_70.name.field_2._M_allocated_capacity + 1
                     );
      section = local_88.
                super__Vector_base<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pBVar3 = local_88.
               super__Vector_base<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
  }
  for (; section != pBVar3; section = section + 1) {
    AddSection(this,((section->regions).
                     super__Vector_base<flatbuffers::BinaryRegion,_std::allocator<flatbuffers::BinaryRegion>_>
                     ._M_impl.super__Vector_impl_data._M_start)->offset,section);
  }
  std::vector<flatbuffers::BinarySection,_std::allocator<flatbuffers::BinarySection>_>::~vector
            (&local_88);
  return;
}

Assistant:

void BinaryAnnotator::FixMissingSections() {
  uint64_t offset = 0;

  std::vector<BinarySection> sections_to_insert;

  for (auto &current_section : sections_) {
    BinarySection &section = current_section.second;
    const uint64_t section_start_offset = current_section.first;
    const uint64_t section_end_offset =
        section.regions.back().offset + section.regions.back().length;

    if (offset < section_start_offset) {
      // We are at an offset that is less then the current section.
      const uint64_t pad_bytes = section_start_offset - offset + 1;

      sections_to_insert.push_back(
          GenerateMissingSection(offset - 1, pad_bytes, binary_));
    }
    offset = section_end_offset + 1;
  }

  // Handle the case where there are still bytes left in the binary that are
  // unaccounted for.
  if (offset < binary_length_) {
    const uint64_t pad_bytes = binary_length_ - offset + 1;
    sections_to_insert.push_back(
        GenerateMissingSection(offset - 1, pad_bytes, binary_));
  }

  for (const BinarySection &section_to_insert : sections_to_insert) {
    AddSection(section_to_insert.regions[0].offset, section_to_insert);
  }
}